

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_classes.h
# Opt level: O3

void __thiscall cppcms::archive_error::archive_error(archive_error *this,string *e)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"cppcms::archive_error: ",e);
  booster::runtime_error::runtime_error(&this->super_runtime_error,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  *(undefined ***)&this->super_runtime_error = &PTR__runtime_error_00289b38;
  (this->super_runtime_error).super_backtrace._vptr_backtrace =
       (_func_int **)&PTR__archive_error_00289b60;
  return;
}

Assistant:

archive_error(std::string const &e) : booster::runtime_error("cppcms::archive_error: " + e)
		{
		}